

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O0

void __thiscall
writer_test_should_write_float_field_Test::TestBody(writer_test_should_write_float_field_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_> *field_00;
  Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_> *field_01;
  Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_> *field_02;
  AssertHelper local_2d8;
  Message local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  undefined1 local_2a8 [8];
  AssertionResult gtest_ar_2;
  string local_290 [32];
  double local_270;
  AssertHelper local_268;
  Message local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_1;
  string local_220 [32];
  double local_200;
  uint local_1f4;
  AssertHelper local_1f0;
  Message local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar;
  ostringstream local_1a0 [8];
  ostringstream oss;
  double local_28;
  undefined1 local_20 [8];
  Field field;
  writer_test_should_write_float_field_Test *this_local;
  
  field._8_8_ = this;
  Fixpp::Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_>::Field
            ((Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_> *)local_20);
  local_28 = 17.35;
  Fixpp::Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_>::set<double>
            ((Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_> *)local_20,&local_28);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  Fixpp::writeField<Fixpp::Field<Fixpp::TagT<44u,Fixpp::Type::Float>>>
            ((Fixpp *)local_1a0,(ostream *)local_20,field_00);
  std::__cxx11::ostringstream::str();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[10]>
            ((EqHelper<false> *)local_1c0,"oss.str()","\"44=17.35|\"",&local_1e0,
             (char (*) [10])"44=17.35|");
  std::__cxx11::string::~string((string *)&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    testing::Message::~Message(&local_1e8);
  }
  local_1f4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  if (local_1f4 == 0) {
    local_200 = 1234567.45;
    Fixpp::Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_>::set<double>
              ((Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_> *)local_20,&local_200);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_220,"",(allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
    std::__cxx11::ostringstream::str((string *)local_1a0);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_1.message_.ptr_ + 7));
    Fixpp::writeField<Fixpp::Field<Fixpp::TagT<44u,Fixpp::Type::Float>>>
              ((Fixpp *)local_1a0,(ostream *)local_20,field_01);
    std::__cxx11::ostringstream::str();
    testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[15]>
              ((EqHelper<false> *)local_238,"oss.str()","\"44=1234567.45|\"",&local_258,
               (char (*) [15])"44=1234567.45|");
    std::__cxx11::string::~string((string *)&local_258);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
    if (!bVar1) {
      testing::Message::Message(&local_260);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
      testing::internal::AssertHelper::AssertHelper
                (&local_268,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
                 ,0x70,pcVar2);
      testing::internal::AssertHelper::operator=(&local_268,&local_260);
      testing::internal::AssertHelper::~AssertHelper(&local_268);
      testing::Message::~Message(&local_260);
    }
    local_1f4 = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
    if (local_1f4 == 0) {
      local_270 = 1000000.0;
      Fixpp::Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_>::set<double>
                ((Field<Fixpp::TagT<44U,_Fixpp::Type::Float>_> *)local_20,&local_270);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_290,"",(allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
      std::__cxx11::ostringstream::str((string *)local_1a0);
      std::__cxx11::string::~string(local_290);
      std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_2.message_.ptr_ + 7));
      Fixpp::writeField<Fixpp::Field<Fixpp::TagT<44u,Fixpp::Type::Float>>>
                ((Fixpp *)local_1a0,(ostream *)local_20,field_02);
      std::__cxx11::ostringstream::str();
      testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[12]>
                ((EqHelper<false> *)local_2a8,"oss.str()","\"44=1000000|\"",&local_2c8,
                 (char (*) [12])"44=1000000|");
      std::__cxx11::string::~string((string *)&local_2c8);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a8);
      if (!bVar1) {
        testing::Message::Message(&local_2d0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2a8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_2d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
                   ,0x77,pcVar2);
        testing::internal::AssertHelper::operator=(&local_2d8,&local_2d0);
        testing::internal::AssertHelper::~AssertHelper(&local_2d8);
        testing::Message::~Message(&local_2d0);
      }
      local_1f4 = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a8);
      if (local_1f4 == 0) {
        local_1f4 = 0;
      }
    }
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return;
}

Assistant:

TEST(writer_test, should_write_float_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::Price>;
    Field field;

    field.set(17.35);

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "44=17.35|");

    field.set(1234567.45);

    oss.str("");
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "44=1234567.45|");

    field.set(1000000.0);

    oss.str("");
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "44=1000000|");
}